

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::initStyleOption(QGraphicsWidget *this,QStyleOption *option)

{
  QGraphicsItem *this_00;
  byte *pbVar1;
  QPalettePrivate *pQVar2;
  undefined8 uVar3;
  bool bVar4;
  LayoutDirection LVar5;
  ColorGroup CVar6;
  QGraphicsWidget *pQVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  undefined8 local_50;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_00 = (QGraphicsItem *)(this + 0x10);
  bVar4 = QGraphicsItem::isEnabled(this_00);
  if (bVar4) {
    *(byte *)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  bVar4 = QGraphicsItem::hasFocus(this_00);
  if (bVar4) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  bVar4 = QGraphicsItem::isUnderMouse(this_00);
  if (bVar4) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  pQVar7 = QGraphicsItem::window(this_00);
  if (pQVar7 != (QGraphicsWidget *)0x0) {
    bVar4 = QGraphicsItem::isActive(&(pQVar7->super_QGraphicsObject).super_QGraphicsItem);
    if (bVar4) {
      pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 2);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  bVar4 = QGraphicsItem::isWindow(this_00);
  if (bVar4) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  LVar5 = layoutDirection(this);
  option->direction = LVar5;
  local_48._16_16_ = (undefined1  [16])size(this);
  local_48._0_8_ = (QPalettePrivate *)0x0;
  local_48._8_8_ = 0.0;
  QVar8 = QRectF::toRect((QRectF *)local_48);
  option->rect = QVar8;
  palette((QGraphicsWidget *)local_48);
  CVar6 = (option->palette).currentGroup;
  (option->palette).currentGroup = local_48._8_4_;
  local_48._8_4_ = CVar6;
  pQVar2 = (option->palette).d;
  (option->palette).d = (QPalettePrivate *)local_48._0_8_;
  local_48._0_8_ = pQVar2;
  QPalette::~QPalette((QPalette *)local_48);
  bVar4 = QGraphicsItem::isEnabled(this_00);
  if (bVar4) {
    bVar4 = QGraphicsItem::isActive(this_00);
    CVar6 = (uint)!bVar4 * 2;
  }
  else {
    CVar6 = Disabled;
  }
  (option->palette).currentGroup = CVar6;
  font((QGraphicsWidget *)local_48);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,(QFont *)local_48);
  uVar3 = *(undefined8 *)&option->fontMetrics;
  *(undefined8 *)&option->fontMetrics = local_50;
  local_50 = uVar3;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
  QFont::~QFont((QFont *)local_48);
  option->styleObject = (QObject *)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::initStyleOption(QStyleOption *option) const
{
    Q_ASSERT(option);

    option->state = QStyle::State_None;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    if (hasFocus())
        option->state |= QStyle::State_HasFocus;
    // if (window->testAttribute(Qt::WA_KeyboardFocusChange)) // ### Window
    //     option->state |= QStyle::State_KeyboardFocusChange;
    if (isUnderMouse())
        option->state |= QStyle::State_MouseOver;
    if (QGraphicsWidget *w = window()) {
        if (w->isActiveWindow())
            option->state |= QStyle::State_Active;
    }
    if (isWindow())
        option->state |= QStyle::State_Window;
    /*
      ###
#ifdef QT_KEYPAD_NAVIGATION
    if (widget->hasEditFocus())
        state |= QStyle::State_HasEditFocus;
#endif
    */
    option->direction = layoutDirection();
    option->rect = rect().toRect(); // ### truncation!
    option->palette = palette();
    if (!isEnabled()) {
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    } else if (isActiveWindow()) {
        option->palette.setCurrentColorGroup(QPalette::Active);
    } else {
        option->palette.setCurrentColorGroup(QPalette::Inactive);
    }
    option->fontMetrics = QFontMetrics(font());
    option->styleObject = const_cast<QGraphicsWidget *>(this);
}